

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

Bip32FormatType __thiscall
cfd::core::KeyFormatData::GetVersionFormatType(KeyFormatData *this,uint32_t version)

{
  Bip32FormatType BVar1;
  CfdException *this_00;
  Bip32FormatType unaff_EBP;
  long lVar2;
  bool bVar3;
  bool bVar4;
  initializer_list<const_cfd::core::ExtkeyVersionPair_*> __l;
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  cache_list;
  allocator_type local_59;
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  local_58;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&this->bip32_;
  local_40._M_string_length = (size_type)&this->bip49_;
  local_40.field_2._M_allocated_capacity = (size_type)&this->bip84_;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_40;
  ::std::
  vector<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
  ::vector(&local_58,__l,&local_59);
  bVar4 = false;
  lVar2 = 0;
  do {
    BVar1 = *(Bip32FormatType *)((long)&kFormatTypeList + lVar2);
    bVar3 = true;
    if ((((this->has_format_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[BVar1 >> 6] >>
          ((ulong)BVar1 & 0x3f) & 1) != 0) &&
       ((local_58.
         super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
         ._M_impl.super__Vector_impl_data._M_start[BVar1]->pubkey_version == version ||
        (local_58.
         super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
         ._M_impl.super__Vector_impl_data._M_start[BVar1]->privkey_version == version)))) {
      bVar3 = false;
      unaff_EBP = BVar1;
    }
    if (!bVar3) break;
    lVar2 = lVar2 + 4;
    bVar4 = lVar2 == 0xc;
  } while (!bVar4);
  if (!bVar4) {
    if (local_58.
        super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<const_cfd::core::ExtkeyVersionPair_*,_std::allocator<const_cfd::core::ExtkeyVersionPair_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return unaff_EBP;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"unknown version.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Bip32FormatType KeyFormatData::GetVersionFormatType(uint32_t version) const {
  std::vector<const ExtkeyVersionPair *> cache_list = {
      &bip32_, &bip49_, &bip84_};
  for (const auto &type : kFormatTypeList) {
    if (has_format_[type]) {
      if ((cache_list[type]->pubkey_version == version) ||
          (cache_list[type]->privkey_version == version)) {
        return type;
      }
    }
  }
  throw CfdException(CfdError::kCfdIllegalArgumentError, "unknown version.");
}